

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_2::ContainsCooperativeMatrix
               (ValidationState_t *_,Instruction *storage)

{
  bool bVar1;
  Op OVar2;
  uint uVar3;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this;
  size_type sVar4;
  Instruction *pIVar5;
  Instruction *member_type;
  ulong uStack_40;
  uint member_type_id;
  size_t member_type_index;
  Instruction *elem_type;
  uint32_t elem_type_id;
  size_t elem_type_index;
  Instruction *storage_local;
  ValidationState_t *__local;
  
  OVar2 = Instruction::opcode(storage);
  if (OVar2 - OpTypeArray < 2) {
    uVar3 = Instruction::GetOperandAs<unsigned_int>(storage,1);
    pIVar5 = ValidationState_t::FindDef(_,uVar3);
    __local._7_1_ = ContainsCooperativeMatrix(_,pIVar5);
  }
  else {
    if (OVar2 == OpTypeStruct) {
      uStack_40 = 1;
      while( true ) {
        this = Instruction::operands(storage);
        sVar4 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(this)
        ;
        if (sVar4 <= uStack_40) break;
        uVar3 = Instruction::GetOperandAs<unsigned_int>(storage,uStack_40);
        pIVar5 = ValidationState_t::FindDef(_,uVar3);
        bVar1 = ContainsCooperativeMatrix(_,pIVar5);
        if (bVar1) {
          return true;
        }
        uStack_40 = uStack_40 + 1;
      }
    }
    else if ((OVar2 == OpTypeCooperativeMatrixKHR) || (OVar2 == OpTypeCooperativeMatrixNV)) {
      return true;
    }
    __local._7_1_ = false;
  }
  return __local._7_1_;
}

Assistant:

bool ContainsCooperativeMatrix(ValidationState_t& _,
                               const Instruction* storage) {
  const size_t elem_type_index = 1;
  uint32_t elem_type_id;
  Instruction* elem_type;

  switch (storage->opcode()) {
    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
      return true;
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray:
      elem_type_id = storage->GetOperandAs<uint32_t>(elem_type_index);
      elem_type = _.FindDef(elem_type_id);
      return ContainsCooperativeMatrix(_, elem_type);
    case spv::Op::OpTypeStruct:
      for (size_t member_type_index = 1;
           member_type_index < storage->operands().size();
           ++member_type_index) {
        auto member_type_id =
            storage->GetOperandAs<uint32_t>(member_type_index);
        auto member_type = _.FindDef(member_type_id);
        if (ContainsCooperativeMatrix(_, member_type)) return true;
      }
      break;
    default:
      break;
  }
  return false;
}